

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall lest::unexpected::~unexpected(unexpected *this)

{
  message::~message(&this->super_message);
  operator_delete(this);
  return;
}

Assistant:

unexpected( location where_, text expr_, text note_ = "" )
    : message( "failed: got unexpected exception", where_, expr_, note_) {}